

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_server2.c
# Opt level: O1

int unhexify(uchar *output,char *input,size_t *olen)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  byte bVar5;
  byte bVar6;
  
  sVar3 = strlen(input);
  *olen = sVar3;
  iVar2 = -1;
  if (sVar3 < 0x41 && (sVar3 & 1) == 0) {
    *olen = sVar3 >> 1;
    if (sVar3 != 0) {
      uVar4 = 0;
      do {
        cVar1 = input[uVar4];
        bVar5 = cVar1 - 0x30;
        if (9 < bVar5) {
          if ((byte)(cVar1 + 0x9fU) < 6) {
            bVar5 = cVar1 + 0xa9;
          }
          else {
            if (5 < (byte)(cVar1 + 0xbfU)) {
              return -1;
            }
            bVar5 = cVar1 - 0x37;
          }
        }
        *output = bVar5 << 4;
        cVar1 = input[uVar4 + 1];
        bVar6 = cVar1 - 0x30;
        if (9 < bVar6) {
          if ((byte)(cVar1 + 0x9fU) < 6) {
            bVar6 = cVar1 + 0xa9;
          }
          else {
            if (5 < (byte)(cVar1 + 0xbfU)) {
              return -1;
            }
            bVar6 = cVar1 - 0x37;
          }
        }
        *output = bVar6 | bVar5 << 4;
        uVar4 = uVar4 + 2;
        output = output + 1;
      } while (uVar4 < *olen * 2);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int unhexify( unsigned char *output, const char *input, size_t *olen )
{
    unsigned char c;
    size_t j;

    *olen = strlen( input );
    if( *olen % 2 != 0 || *olen / 2 > MBEDTLS_PSK_MAX_LEN )
        return( -1 );
    *olen /= 2;

    for( j = 0; j < *olen * 2; j += 2 )
    {
        c = input[j];
        HEX2NUM( c );
        output[ j / 2 ] = c << 4;

        c = input[j + 1];
        HEX2NUM( c );
        output[ j / 2 ] |= c;
    }

    return( 0 );
}